

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

uint __thiscall Assimp::XGLImporter::ReadIDAttr(XGLImporter *this)

{
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  
  uVar2 = (*((this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      peVar1 = (this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar3 = (*peVar1->_vptr_IIrrXMLReader[5])(peVar1,(ulong)uVar4);
      if ((char *)CONCAT44(extraout_var,iVar3) == (char *)0x0) {
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                      ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar3 = strcasecmp((char *)CONCAT44(extraout_var,iVar3),"id");
      if (iVar3 == 0) {
        peVar1 = (this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar2 = (*peVar1->_vptr_IIrrXMLReader[10])(peVar1,(ulong)uVar4);
        return uVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return 0xffffffff;
}

Assistant:

unsigned int XGLImporter::ReadIDAttr()
{
    for(int i = 0, e = m_reader->getAttributeCount(); i < e; ++i) {

        if(!ASSIMP_stricmp(m_reader->getAttributeName(i),"id")) {
            return m_reader->getAttributeValueAsInt(i);
        }
    }
    return ~0u;
}